

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configmng.cpp
# Opt level: O3

void __thiscall banksia::Config::updateOption(Config *this,Option *o)

{
  pointer pOVar1;
  pointer __s2;
  size_t __n;
  bool bVar2;
  int iVar3;
  pointer this_00;
  
  this_00 = (this->optionList).super__Vector_base<banksia::Option,_std::allocator<banksia::Option>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->optionList).super__Vector_base<banksia::Option,_std::allocator<banksia::Option>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pOVar1) {
    __s2 = (o->name)._M_dataplus._M_p;
    __n = (o->name)._M_string_length;
    do {
      if ((this_00->name)._M_string_length == __n) {
        if (__n == 0) {
LAB_0014c915:
          bVar2 = Option::operator==(this_00,o);
          if (bVar2) {
            return;
          }
          Option::update(this_00,o);
          return;
        }
        iVar3 = bcmp((this_00->name)._M_dataplus._M_p,__s2,__n);
        if (iVar3 == 0) goto LAB_0014c915;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pOVar1);
  }
  appendOption(this,o);
  return;
}

Assistant:

void Config::updateOption(const Option& o)
{
    for(auto && option : optionList) {
        if (option.name == o.name) {
            if (option != o) {
                option.update(o);
            }
            return;
        }
    }
    appendOption(o);
}